

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,Register8Bits dest,Registers srcMemReg,int offset)

{
  undefined8 in_RAX;
  undefined3 in_register_00000011;
  uchar *__args;
  size_t i;
  long lVar1;
  IntToBytes converter;
  undefined8 local_28;
  
  __args = (uchar *)&local_28;
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_28._0_4_ = CONCAT13(0x8a,(int3)in_RAX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,(uchar *)((long)&local_28 + 3));
  if (CONCAT31(in_register_00000011,srcMemReg) == 4) {
    local_28 = CONCAT62(local_28._2_6_,CONCAT11(dest << 3,(uchar)local_28)) | 0x8400;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,(uchar *)((long)&local_28 + 1));
    local_28 = CONCAT71(local_28._1_7_,0x24);
  }
  else {
    __args = (uchar *)((long)&local_28 + 2);
    local_28 = CONCAT53(local_28._3_5_,CONCAT12(dest << 3 | srcMemReg,(undefined2)local_28)) |
               0x800000;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,__args);
  local_28 = CONCAT44(offset,(undefined4)local_28);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_28 + lVar1 + 4));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, Register8Bits dest, Registers srcMemReg, int offset) {
		codeGen.push_back(0x8a);

		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}